

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiveProxy.cpp
# Opt level: O0

int __thiscall
aeron::archive::ArchiveProxy::connect(ArchiveProxy *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  bool bVar1;
  ConnectRequest *pCVar2;
  uint64_t uVar3;
  undefined7 extraout_var;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000034;
  undefined1 local_60 [8];
  ConnectRequest msg;
  int64_t correlationId_local;
  int32_t responseStreamId_local;
  string *responseChannel_local;
  ArchiveProxy *this_local;
  
  msg.m_actingVersion = CONCAT44(in_register_0000000c,__len);
  io::aeron::archive::codecs::ConnectRequest::ConnectRequest((ConnectRequest *)local_60);
  pCVar2 = wrapAndApplyHeader<io::aeron::archive::codecs::ConnectRequest>
                     (this,(ConnectRequest *)local_60);
  pCVar2 = io::aeron::archive::codecs::ConnectRequest::correlationId(pCVar2,msg.m_actingVersion);
  pCVar2 = io::aeron::archive::codecs::ConnectRequest::responseStreamId(pCVar2,(int32_t)__addr);
  io::aeron::archive::codecs::ConnectRequest::putResponseChannel
            (pCVar2,(string *)CONCAT44(in_register_00000034,__fd));
  uVar3 = io::aeron::archive::codecs::ConnectRequest::encodedLength((ConnectRequest *)local_60);
  bVar1 = offerWithTimeout(this,(int32_t)uVar3,(AgentInvoker<aeron::ClientConductor> *)0x0);
  return (int)CONCAT71(extraout_var,bVar1);
}

Assistant:

bool ArchiveProxy::connect(const std::string& responseChannel, std::int32_t responseStreamId,
                           std::int64_t correlationId) {
    codecs::ConnectRequest msg;

    wrapAndApplyHeader(msg)
        .correlationId(correlationId)
        .responseStreamId(responseStreamId)
        .putResponseChannel(responseChannel);

    return offerWithTimeout(msg.encodedLength(), nullptr);
}